

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_ctx_close(nng_ctx c)

{
  int iVar1;
  nni_ctx *local_10;
  nni_ctx *ctx;
  
  iVar1 = nni_ctx_find(&local_10,c.id);
  if (iVar1 == 0) {
    nni_ctx_close(local_10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_ctx_close(nng_ctx c)
{
	int      rv;
	nni_ctx *ctx;

	if ((rv = nni_ctx_find(&ctx, c.id)) != 0) {
		return (rv);
	}
	// no release, close releases implicitly.
	nni_ctx_close(ctx);
	return (0);
}